

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_frac_digit_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  uint uVar1;
  bool bVar2;
  error_category *peVar3;
  error_code err;
  
  uVar1 = (this->super_matcher<pstore::json::null_output>).state_;
  if ((uVar1 & 0xfffffffe) != 6) {
    assert_failed("this->get_state () == frac_initial_digit_state || this->get_state () == frac_digit_state"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x272);
  }
  if ((c & 0xdfU) == 0x45) {
    if ((this->super_matcher<pstore::json::null_output>).field_0xd == '\x01') {
      (this->fp_acc_).whole_part =
           ((double)CONCAT44(0x45300000,(int)(this->int_acc_ >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)this->int_acc_) - 4503599627370496.0);
      (this->super_matcher<pstore::json::null_output>).field_0xd = 0;
    }
    if (uVar1 == 6) {
LAB_0014deff:
      peVar3 = get_error_category();
      err._M_cat = peVar3;
      err._0_8_ = 0xb;
      bVar2 = parser<pstore::json::null_output>::set_error(parser,err);
      if (!bVar2) {
        return true;
      }
      (this->super_matcher<pstore::json::null_output>).state_ = 1;
      return true;
    }
    (this->super_matcher<pstore::json::null_output>).state_ = 8;
  }
  else {
    if (9 < (byte)(c - 0x30U)) {
      if (uVar1 != 6) {
        (this->super_matcher<pstore::json::null_output>).state_ = 1;
        make_result(this,parser);
        return false;
      }
      goto LAB_0014deff;
    }
    if ((this->super_matcher<pstore::json::null_output>).field_0xd == '\x01') {
      (this->fp_acc_).whole_part =
           ((double)CONCAT44(0x45300000,(int)(this->int_acc_ >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)this->int_acc_) - 4503599627370496.0);
      (this->super_matcher<pstore::json::null_output>).field_0xd = 0;
    }
    (this->fp_acc_).frac_part = (this->fp_acc_).frac_part * 10.0 + (double)(int)(char)(c - 0x30U);
    (this->fp_acc_).frac_scale = (this->fp_acc_).frac_scale * 10.0;
    (this->super_matcher<pstore::json::null_output>).state_ = 7;
  }
  return true;
}

Assistant:

void set_state (int const s) noexcept { state_ = s; }